

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O2

int __thiscall
CGraphicsBackend_SDL_OpenGL::GetVideoModes
          (CGraphicsBackend_SDL_OpenGL *this,CVideoMode *pModes,int MaxModes,int Screen)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  int iVar7;
  long in_FS_OFFSET;
  SDL_DisplayMode Mode;
  undefined1 local_50 [4];
  int local_4c;
  int local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = SDL_GetNumDisplayModes(Screen);
  if (iVar1 < 0) {
    uVar3 = SDL_GetError();
    uVar5 = 0;
    dbg_msg("gfx","unable to get the number of display modes: %s",uVar3);
  }
  else {
    uVar5 = 0;
    iVar7 = 0;
    while ((iVar7 < iVar1 && ((int)uVar5 < MaxModes))) {
      iVar2 = SDL_GetDisplayMode(Screen,iVar7,local_50);
      if (iVar2 < 0) {
        uVar3 = SDL_GetError();
        dbg_msg("gfx","unable to get display mode: %s",uVar3);
      }
      else {
        uVar4 = 0;
        if (0 < (int)uVar5) {
          uVar4 = (ulong)uVar5;
        }
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          if ((pModes[uVar6].m_Width == local_4c) && (pModes[uVar6].m_Height == local_48))
          goto LAB_001165b4;
        }
        pModes[(int)uVar5].m_Width = local_4c;
        pModes[(int)uVar5].m_Height = local_48;
        uVar5 = uVar5 + 1;
      }
LAB_001165b4:
      iVar7 = iVar7 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::GetVideoModes(CVideoMode *pModes, int MaxModes, int Screen)
{
	int NumModes = SDL_GetNumDisplayModes(Screen);
	if(NumModes < 0)
	{
		dbg_msg("gfx", "unable to get the number of display modes: %s", SDL_GetError());
		return 0;
	}

	int ModesCount = 0;
	for(int i = 0; i < NumModes && ModesCount < MaxModes; i++)
	{
		SDL_DisplayMode Mode;
		if(SDL_GetDisplayMode(Screen, i, &Mode) < 0)
		{
			dbg_msg("gfx", "unable to get display mode: %s", SDL_GetError());
			continue;
		}

		bool AlreadyFound = false;
		for(int j = 0; j < ModesCount; j++)
		{
			if(pModes[j].m_Width == Mode.w && pModes[j].m_Height == Mode.h)
			{
				AlreadyFound = true;
				break;
			}
		}
		if(AlreadyFound)
			continue;

		pModes[ModesCount].m_Width = Mode.w;
		pModes[ModesCount].m_Height = Mode.h;
		ModesCount++;
	}
	return ModesCount;
}